

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qbuffer.cpp
# Opt level: O1

int __thiscall QBuffer::qt_metacall(QBuffer *this,Call _c,int _id,void **_a)

{
  QObjectData *pQVar1;
  QObject *this_00;
  int iVar2;
  
  iVar2 = QIODevice::qt_metacall(&this->super_QIODevice,_c,_id,_a);
  if (-1 < iVar2) {
    if (_c == InvokeMetaMethod) {
      if (iVar2 == 0) {
        pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
        this_00 = pQVar1->q_ptr;
        QIODevice::bytesWritten((QIODevice *)this_00,(qint64)pQVar1[5].children.d.d);
        pQVar1[5].children.d.d = (Data *)0x0;
        QIODevice::readyRead((QIODevice *)this_00);
        *(undefined1 *)((long)&pQVar1[5].children.d.ptr + 4) = 0;
      }
      iVar2 = iVar2 + -1;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (iVar2 < 1) {
        *(undefined8 *)*_a = 0;
      }
      iVar2 = iVar2 + -1;
    }
  }
  return iVar2;
}

Assistant:

int QBuffer::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QIODevice::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}